

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O3

floatx80 propagateFloatx80NaN_mips64(floatx80 a,floatx80 b,float_status *status)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  floatx80 fVar8;
  
  uVar4 = a._8_4_;
  uVar2 = b._8_4_;
  if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
      (~uVar4 & 0x7fff) != 0) {
    bVar5 = 2;
    if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0 &&
        (~uVar2 & 0x7fff) == 0) goto LAB_008631f7;
LAB_00863246:
    bVar6 = false;
    bVar1 = false;
  }
  else {
    if (status->snan_bit_is_one == '\0') {
      bVar6 = ((undefined1  [16])a & (undefined1  [16])0x4000000000000000) == (undefined1  [16])0x0
              && ((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) !=
                 (undefined1  [16])0x0;
    }
    else {
      bVar6 = ((undefined1  [16])a & (undefined1  [16])0x4000000000000000) != (undefined1  [16])0x0;
    }
    if ((~uVar2 & 0x7fff) == 0 &&
        ((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) {
      bVar5 = bVar6 | 4;
LAB_008631f7:
      if (status->snan_bit_is_one == '\0') {
        bVar7 = ((undefined1  [16])b & (undefined1  [16])0x4000000000000000) ==
                (undefined1  [16])0x0 &&
                ((undefined1  [16])b & (undefined1  [16])0x3fffffffffffffff) !=
                (undefined1  [16])0x0;
      }
      else {
        bVar7 = ((undefined1  [16])b & (undefined1  [16])0x4000000000000000) !=
                (undefined1  [16])0x0;
      }
      bVar1 = (bool)(bVar5 != 5 | bVar7);
      bVar6 = bVar5 == 5;
      if ((!bVar6) && (!bVar7)) goto LAB_00863246;
    }
    else {
      bVar5 = 4;
      bVar1 = false;
      if (bVar6 == false) goto LAB_00863246;
      bVar6 = true;
      bVar5 = 5;
    }
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  if (status->default_nan_mode == '\0') {
    if (bVar6) {
      if (status->snan_bit_is_one != '\0') {
LAB_008632df:
        __assert_fail("!snan_bit_is_one(status)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat-specialize.inc.c"
                      ,0x33f,"floatx80 floatx80_silence_nan_mips64(floatx80, float_status *)");
      }
      uVar3 = a.low | 0xc000000000000000;
      uVar2 = uVar4;
    }
    else if (bVar1) {
      if (status->snan_bit_is_one != '\0') goto LAB_008632df;
      uVar3 = b.low | 0xc000000000000000;
    }
    else {
      uVar3 = b.low;
      if (bVar5 == 4) {
        uVar3 = a.low;
        uVar2 = uVar4;
      }
    }
  }
  else {
    if (status->snan_bit_is_one != '\0') {
      __assert_fail("!snan_bit_is_one(status)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat-specialize.inc.c"
                    ,0xc5,"floatx80 floatx80_default_nan_mips64(float_status *)");
    }
    uVar3 = 0xc000000000000000;
    uVar2 = (uint)CONCAT62(b._10_6_,0xffff);
  }
  fVar8._8_4_ = uVar2;
  fVar8.low = uVar3;
  fVar8._12_4_ = 0;
  return fVar8;
}

Assistant:

floatx80 propagateFloatx80NaN(floatx80 a, floatx80 b, float_status *status)
{
    flag aIsLargerSignificand;
    FloatClass a_cls, b_cls;

    /* This is not complete, but is good enough for pickNaN.  */
    a_cls = (!floatx80_is_any_nan(a)
             ? float_class_normal
             : floatx80_is_signaling_nan(a, status)
             ? float_class_snan
             : float_class_qnan);
    b_cls = (!floatx80_is_any_nan(b)
             ? float_class_normal
             : floatx80_is_signaling_nan(b, status)
             ? float_class_snan
             : float_class_qnan);

    if (is_snan(a_cls) || is_snan(b_cls)) {
        float_raise(float_flag_invalid, status);
    }

    if (status->default_nan_mode) {
        return floatx80_default_nan(status);
    }

    if (a.low < b.low) {
        aIsLargerSignificand = 0;
    } else if (b.low < a.low) {
        aIsLargerSignificand = 1;
    } else {
        aIsLargerSignificand = (a.high < b.high) ? 1 : 0;
    }

    if (pickNaN(a_cls, b_cls, aIsLargerSignificand)) {
        if (is_snan(b_cls)) {
            return floatx80_silence_nan(b, status);
        }
        return b;
    } else {
        if (is_snan(a_cls)) {
            return floatx80_silence_nan(a, status);
        }
        return a;
    }
}